

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O3

void __thiscall QDockWidgetGroupWindow::adjustFlags(QDockWidgetGroupWindow *this)

{
  QFlagsStorage<Qt::WindowType> QVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  DockWidgetFeatures DVar6;
  QWidget *this_00;
  QLayout *pQVar7;
  QWindow *pQVar8;
  QSize QVar9;
  uint uVar10;
  QFlagsStorage<Qt::WindowType> flags;
  long in_FS_OFFSET;
  QRect QVar11;
  undefined1 local_48 [8];
  undefined8 uStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  QVar1.i = ((QFlagsStorage<Qt::WindowType> *)(*(long *)(this + 0x20) + 0xc))->i;
  this_00 = &activeTabbedDockWidget(this)->super_QWidget;
  if (this_00 == (QWidget *)0x0) {
    flags.i = QVar1.i & 0xfdffe7ff | 0x2001000;
  }
  else {
    pQVar7 = QWidget::layout((QWidget *)this);
    bVar5 = hasNativeDecos(*(QDockWidgetGroupWindow **)(*(long *)&pQVar7->field_0x8 + 0x10));
    if (bVar5) {
      DVar6 = QDockWidget::features((QDockWidget *)this_00);
      uVar10 = QVar1.i | 0xa001000;
      if (((uint)DVar6.super_QFlagsStorageHelper<QDockWidget::DockWidgetFeature,_4>.
                 super_QFlagsStorage<QDockWidget::DockWidgetFeature>.i & 1) == 0) {
        uVar10 = QVar1.i & 0xf5ffe7ff | 0x2001000;
      }
      flags.i = uVar10 & 0xfffff7ff;
    }
    else {
      flags.i = QVar1.i & 0xf5ffe7ff | 0x800;
    }
  }
  if (QVar1.i != flags.i) {
    pQVar8 = QWidget::windowHandle((QWidget *)this);
    if (pQVar8 == (QWindow *)0x0) {
      QWidget::create((QWidget *)this,0,true,true);
    }
    QWidget::setWindowFlags((QWidget *)this,(WindowFlags)flags.i);
    if ((QVar1.i >> 0xb & 1) == 0) {
      if ((flags.i >> 0xb & 1) != 0) {
        local_48 = *(undefined1 (*) [8])(*(long *)(this + 0x20) + 0x14);
        uStack_40 = *(char16_t **)(*(long *)(this + 0x20) + 0x1c);
        QVar11 = QWidget::frameGeometry((QWidget *)this);
        local_48._4_4_ = QVar11.y1.m_i.m_i;
        iVar2 = *(int *)(*(long *)(this + 0x20) + 0x18);
        QVar11 = QWidget::frameGeometry((QWidget *)this);
        QVar9 = QWidget::frameSize((QWidget *)this);
        *(ulong *)(this + 0x50) =
             CONCAT44(iVar2 - QVar11.y1.m_i,
                      ~*(uint *)(*(long *)(this + 0x20) + 0x1c) + QVar9.wd.m_i.m_i +
                      *(int *)(*(long *)(this + 0x20) + 0x14));
        QWidget::setGeometry((QWidget *)this,(QRect *)local_48);
      }
    }
    else if ((flags.i >> 0xb & 1) == 0) {
      if (-1 < (int)(*(uint *)(this + 0x50) | *(uint *)(this + 0x54))) {
        uVar3 = *(undefined8 *)(*(long *)(this + 0x20) + 0x14);
        uVar4 = *(undefined8 *)(*(long *)(this + 0x20) + 0x1c);
        uVar10 = *(uint *)(this + 0x50) >> 1;
        local_48._0_4_ = (undefined4)uVar3;
        local_48._4_4_ = (undefined4)((ulong)uVar3 >> 0x20);
        local_48._0_4_ = local_48._0_4_ - uVar10;
        uStack_40._0_4_ = (int)uVar4;
        uStack_40._4_4_ = (int)((ulong)uVar4 >> 0x20);
        uStack_40 = (char16_t *)
                    CONCAT44(uStack_40._4_4_ - *(uint *)(this + 0x54),uStack_40._0_4_ - uVar10);
        QWidget::setGeometry((QWidget *)this,(QRect *)local_48);
        *(undefined8 *)(this + 0x50) = 0xffffffffffffffff;
      }
    }
    bVar5 = hasVisibleDockWidgets(this);
    (**(code **)(*(long *)this + 0x68))(this,bVar5);
  }
  if (this_00 == (QWidget *)0x0) {
    this_00 = *(QWidget **)(*(long *)(this + 8) + 0x10);
  }
  QWidget::windowTitle((QString *)local_48,this_00);
  QWidget::setWindowTitle((QWidget *)this,(QString *)local_48);
  if (local_48 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)local_48 = *(int *)local_48 + -1;
    UNLOCK();
    if (*(int *)local_48 == 0) {
      QArrayData::deallocate((QArrayData *)local_48,2,0x10);
    }
  }
  QWidget::windowIcon((QWidget *)local_48);
  QWidget::setWindowIcon((QWidget *)this,(QIcon *)local_48);
  QIcon::~QIcon((QIcon *)local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDockWidgetGroupWindow::adjustFlags()
{
    Qt::WindowFlags oldFlags = windowFlags();
    Qt::WindowFlags flags = oldFlags;

#if QT_CONFIG(tabbar)
    QDockWidget *top = activeTabbedDockWidget();
#else
    QDockWidget *top = nullptr;
#endif
    if (!top) { // nested tabs, show window decoration
        flags =
            ((oldFlags & ~Qt::FramelessWindowHint) | Qt::CustomizeWindowHint | Qt::WindowTitleHint);
    } else if (static_cast<QDockWidgetGroupLayout *>(layout())->nativeWindowDeco()) {
        flags |= Qt::CustomizeWindowHint | Qt::WindowTitleHint;
        flags.setFlag(Qt::WindowCloseButtonHint, top->features() & QDockWidget::DockWidgetClosable);
        flags &= ~Qt::FramelessWindowHint;
    } else {
        flags &= ~(Qt::WindowCloseButtonHint | Qt::CustomizeWindowHint | Qt::WindowTitleHint);
        flags |= Qt::FramelessWindowHint;
    }

    if (oldFlags != flags) {
        if (!windowHandle())
            create(); // The desired geometry is forgotten if we call setWindowFlags before having a window
        setWindowFlags(flags);
        const bool gainedNativeDecos = (oldFlags & Qt::FramelessWindowHint) && !(flags & Qt::FramelessWindowHint);
        const bool lostNativeDecos = !(oldFlags & Qt::FramelessWindowHint) && (flags & Qt::FramelessWindowHint);

        // Adjust the geometry after gaining/losing decos, so that the client area appears always
        // at the same place when tabbing
        if (lostNativeDecos) {
            QRect newGeometry = geometry();
            newGeometry.setTop(frameGeometry().top());
            const int bottomFrame = geometry().top() - frameGeometry().top();
            m_removedFrameSize = QSize((frameSize() - size()).width(), bottomFrame);
            setGeometry(newGeometry);
        } else if (gainedNativeDecos && m_removedFrameSize.isValid()) {
            QRect r = geometry();
            r.adjust(-m_removedFrameSize.width() / 2, 0,
                     -m_removedFrameSize.width() / 2, -m_removedFrameSize.height());
            setGeometry(r);
            m_removedFrameSize = QSize();
        }

        setVisible(hasVisibleDockWidgets());
    }

    QWidget *titleBarOf = top ? top : parentWidget();
    setWindowTitle(titleBarOf->windowTitle());
    setWindowIcon(titleBarOf->windowIcon());
}